

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O1

int __thiscall CmdLineArgsParser::Parse(CmdLineArgsParser *this,LPWSTR oneArg)

{
  LPWSTR pWVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  WCHAR local_428 [4];
  char16 buffer [512];
  
  memset(local_428,0,0x400);
  this->pszCurrentArg = oneArg;
  if (oneArg == (LPWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                       ,0x288,"(0 != this->pszCurrentArg)","How can command line give NULL argv\'s")
    ;
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pWVar1 = this->pszCurrentArg;
  if (*pWVar1 == L'-') {
    if (pWVar1[1] == L'-') {
      this->pszCurrentArg = pWVar1 + 1;
    }
    pWVar1 = this->pszCurrentArg;
    this->pszCurrentArg = pWVar1 + 1;
    if (pWVar1[1] == L'?') {
      if (this->pCustomConfigFlags == (ICustomConfigFlags *)0x0) {
        iVar6 = -1;
        Js::ConfigFlagsTable::PrintUsageString();
      }
      else {
        iVar6 = -1;
        (*(code *)**(undefined8 **)this->pCustomConfigFlags)();
      }
    }
    else {
      iVar6 = 0;
      ParseFlag(this);
    }
  }
  else {
    if ((this->flagTable->Filename).pszValue != (char16 *)0x0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = L"Duplicate filename entry";
      __cxa_throw(puVar5,&Exception::typeinfo,0);
    }
    iVar6 = 0;
    ParseString(this,local_428,0x200,false);
    Js::String::Set(&this->flagTable->Filename,local_428);
  }
  return iVar6;
}

Assistant:

int CmdLineArgsParser::Parse(__in LPWSTR oneArg) throw()
{
    int err = 0;
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    this->pszCurrentArg = oneArg;
    AssertMsg(NULL != this->pszCurrentArg, "How can command line give NULL argv's");
    try
    {
        switch(CurChar())
        {
        case '-' :
            if ('-' == PeekChar())
            {
                //support --
                NextChar();
            }
            //fallthrough
#ifdef _WIN32
        // Only support '/' as a command line switch start char on Windows
        // for legacy reason. Deprecate on xplat, as it starts a path on Unix.
        case '/':
#endif
            NextChar();
            if('?' == CurChar())
            {
                PrintUsage();
                return -1;
            }
            ParseFlag();
            break;
        default:
            if(NULL != this->flagTable.Filename)
            {
                throw Exception(_u("Duplicate filename entry"));
            }

            this->flagTable.Filename = ParseString(buffer, MaxTokenSize, false);
            break;
        }
    }
    catch(Exception &exp)
    {
        Output::Print(_u("%s : %s\n"), (LPCWSTR)exp, oneArg);
        err = -1;
    }
    return err;
}